

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void trap_lore(wchar_t oid)

{
  trap_kind_conflict *ptVar1;
  textblock *tb;
  char *buf;
  textblock *tba;
  textblock *tba_00;
  
  ptVar1 = trap_info;
  if (trap_info[oid].text != (char *)0x0) {
    tb = textblock_new();
    buf = string_make(ptVar1[oid].desc);
    tba = effect_describe(ptVar1[oid].effect,"This trap ",0,false);
    tba_00 = effect_describe(ptVar1[oid].effect_xtra,"if you\'re unlucky it also ",0,false);
    my_strcap(buf);
    textblock_append_c(tb,'\x0e',"%s");
    string_free(buf);
    textblock_append(tb,"\n");
    textblock_append(tb,"%s",ptVar1[oid].text);
    textblock_append(tb,"\n");
    if (tba != (textblock *)0x0) {
      textblock_append(tb,"\n");
      textblock_append_textblock(tb,tba);
      textblock_free(tba);
      if (tba_00 != (textblock *)0x0) {
        textblock_append(tb,"; ");
        textblock_append_textblock(tb,tba_00);
        textblock_free(tba_00);
      }
      textblock_append(tb,".\n");
    }
    textui_textblock_show(tb,(region)ZEXT816(0),(char *)0x0);
    textblock_free(tb);
    return;
  }
  return;
}

Assistant:

static void trap_lore(int oid)
{
	struct trap_kind *trap = &trap_info[oid];

	if (trap->text) {
		textblock *tb = textblock_new();
		char *title = string_make(trap->desc);
		textblock *tbe = effect_describe(trap->effect, "This trap ", 0, false);
		textblock *tbex = effect_describe(trap->effect_xtra,
										  "if you're unlucky it also ", 0,
										  false);

		my_strcap(title);
		textblock_append_c(tb, COLOUR_L_BLUE, "%s", title);
		string_free(title);
		textblock_append(tb, "\n");
		textblock_append(tb, "%s", trap->text);
		textblock_append(tb, "\n");
		if (tbe) {
			textblock_append(tb, "\n");
			textblock_append_textblock(tb, tbe);
			textblock_free(tbe);
			if (tbex) {
				textblock_append(tb, "; ");
				textblock_append_textblock(tb, tbex);
				textblock_free(tbex);
			}
			textblock_append(tb, ".\n");
		}
		textui_textblock_show(tb, SCREEN_REGION, NULL);
		textblock_free(tb);
	}
}